

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Deconvolution *pDVar14;
  Mat *pMVar15;
  pointer piVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  void *pvVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  void *pvVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  undefined4 uVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  int iVar41;
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_158;
  allocator_type local_149;
  Deconvolution *local_148;
  long local_140;
  Mat local_138;
  Mat *local_f0;
  ulong local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  float *local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  ulong local_98;
  Option *local_90;
  void *local_88;
  long local_80;
  void *local_78;
  long local_70;
  long local_68;
  Mat *local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar18 = bottom_blob->w;
  local_98 = (ulong)uVar18;
  uVar19 = bottom_blob->h;
  local_a0 = (ulong)uVar19;
  uVar3 = bottom_blob->c;
  iVar25 = this->kernel_w;
  iVar41 = this->dilation_w;
  sVar5 = bottom_blob->elemsize;
  iVar33 = this->stride_w;
  iVar4 = this->kernel_h;
  iVar29 = this->dilation_h;
  iVar21 = this->stride_h;
  iVar22 = this->output_pad_right;
  iVar26 = this->output_pad_bottom;
  local_138.cstep = 0;
  local_138.data = (void *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  auVar36._0_4_ = -(uint)(0 < this->pad_left);
  auVar36._4_4_ = -(uint)(0 < this->pad_right);
  auVar36._8_4_ = -(uint)(0 < this->pad_top);
  auVar36._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar17 = movmskps(uVar18,auVar36);
  lVar32 = 0x10;
  if ((iVar17 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar32 = 8, &local_138 != top_blob)))) {
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    lVar32 = 8;
    local_138.data = top_blob->data;
    local_138.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_138.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_138.elemsize = top_blob->elemsize;
    local_138.elempack = top_blob->elempack;
    local_138.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_138.c = top_blob->c;
    local_138.cstep = top_blob->cstep;
    local_138.dims = uVar10;
    local_138.w = uVar11;
    local_138.h = uVar12;
    local_138.d = uVar13;
  }
  iVar33 = (iVar25 + -1) * iVar41 + (uVar18 - 1) * iVar33 + iVar22 + 1;
  iVar25 = iVar26 + 1 + (iVar4 + -1) * iVar29 + (uVar19 - 1) * iVar21;
  local_148 = this;
  local_f0 = top_blob;
  local_60 = bottom_blob;
  Mat::create(&local_138,iVar33,iVar25,this->num_output,sVar5,
              *(Allocator **)(&opt->lightmode + lVar32));
  pDVar14 = local_148;
  iVar41 = -100;
  if ((local_138.data != (void *)0x0) && ((long)local_138.c * local_138.cstep != 0)) {
    uVar18 = local_148->kernel_w * local_148->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar18,&local_149);
    piVar16 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    iVar41 = pDVar14->kernel_h;
    if (0 < iVar41) {
      iVar4 = pDVar14->dilation_h;
      iVar29 = pDVar14->kernel_w;
      iVar21 = pDVar14->dilation_w * iVar29;
      iVar22 = 0;
      iVar26 = 0;
      iVar17 = 0;
      do {
        if (0 < iVar29) {
          lVar32 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar22 + lVar32] = iVar26;
            iVar26 = iVar26 + pDVar14->dilation_w;
            iVar29 = pDVar14->kernel_w;
            lVar32 = lVar32 + 1;
          } while ((int)lVar32 < iVar29);
          iVar22 = iVar22 + (int)lVar32;
          iVar41 = pDVar14->kernel_h;
        }
        iVar26 = iVar26 + (iVar4 * iVar33 - iVar21);
        iVar17 = iVar17 + 1;
      } while (iVar17 < iVar41);
    }
    local_70 = (long)pDVar14->num_output;
    local_90 = opt;
    if (0 < local_70) {
      local_d4 = local_138.dims;
      local_c8 = local_138.cstep * local_138.elemsize;
      local_d8 = local_138.h * local_138.w;
      local_dc = local_148->bias_term;
      local_88 = (local_148->bias_data).data;
      local_80 = local_138.elemsize * (long)local_138.w;
      local_b0 = (ulong)(uint)(iVar25 * iVar33);
      local_d0 = (float *)(local_148->activation_params).data;
      lVar32 = (long)local_138.data + 0xc;
      local_e0 = uVar3 * uVar18;
      local_e8 = 0;
      local_c0 = (ulong)(local_148->activation_type - 1);
      local_78 = local_138.data;
      lVar31 = 0;
      pvVar28 = local_138.data;
      auVar42 = _DAT_00312150;
      auVar43 = _DAT_00312160;
      auVar36 = _DAT_003120e0;
      do {
        iVar25 = 1;
        if (local_d4 != 3) {
          iVar25 = local_138.d;
        }
        if (local_dc == 0) {
          uVar34 = 0;
        }
        else {
          uVar34 = *(undefined4 *)((long)local_88 + lVar31 * 4);
        }
        uVar19 = iVar25 * local_d8;
        if (0 < (int)uVar19) {
          lVar23 = (ulong)uVar19 - 1;
          auVar37._8_4_ = (int)lVar23;
          auVar37._0_8_ = lVar23;
          auVar37._12_4_ = (int)((ulong)lVar23 >> 0x20);
          auVar37 = auVar37 ^ auVar36;
          uVar24 = 0;
          do {
            auVar39._8_4_ = (int)uVar24;
            auVar39._0_8_ = uVar24;
            auVar39._12_4_ = (int)(uVar24 >> 0x20);
            auVar40 = (auVar39 | auVar43) ^ auVar36;
            iVar25 = auVar37._4_4_;
            if ((bool)(~(iVar25 < auVar40._4_4_ ||
                        auVar37._0_4_ < auVar40._0_4_ && auVar40._4_4_ == iVar25) & 1)) {
              *(undefined4 *)(lVar32 + -0xc + uVar24 * 4) = uVar34;
            }
            if (auVar40._12_4_ <= auVar37._12_4_ &&
                (auVar40._8_4_ <= auVar37._8_4_ || auVar40._12_4_ != auVar37._12_4_)) {
              *(undefined4 *)(lVar32 + -8 + uVar24 * 4) = uVar34;
            }
            auVar39 = (auVar39 | auVar42) ^ auVar36;
            iVar41 = auVar39._4_4_;
            if (iVar41 <= iVar25 && (iVar41 != iVar25 || auVar39._0_4_ <= auVar37._0_4_)) {
              *(undefined4 *)(lVar32 + -4 + uVar24 * 4) = uVar34;
              *(undefined4 *)(lVar32 + uVar24 * 4) = uVar34;
            }
            uVar24 = uVar24 + 4;
          } while ((uVar19 + 3 & 0xfffffffc) != uVar24);
        }
        if (0 < (int)local_a0) {
          local_50 = (void *)(local_c8 * lVar31 + (long)local_78);
          local_58 = local_148->stride_h * local_80;
          local_140 = (long)local_148->stride_w;
          pvVar7 = (local_148->weight_data).data;
          local_158 = 0;
          do {
            if (0 < (int)local_98) {
              iVar25 = local_60->w;
              sVar5 = local_60->elemsize;
              sVar8 = local_60->cstep;
              pvVar9 = local_60->data;
              uVar24 = 0;
              do {
                if (0 < (int)uVar3) {
                  lVar23 = uVar24 * local_140 * 4 + local_158 * local_58;
                  uVar30 = 0;
                  pvVar20 = (void *)((long)(int)local_e8 * 4 + (long)pvVar7);
                  do {
                    if (0 < (int)uVar18) {
                      fVar35 = *(float *)((long)pvVar9 +
                                         sVar8 * sVar5 * uVar30 +
                                         uVar24 * 4 + (long)iVar25 * local_158 * sVar5);
                      uVar27 = 0;
                      do {
                        *(float *)((long)local_50 + (long)piVar16[uVar27] * 4 + lVar23) =
                             *(float *)((long)pvVar20 + uVar27 * 4) * fVar35 +
                             *(float *)((long)local_50 + (long)piVar16[uVar27] * 4 + lVar23);
                        uVar27 = uVar27 + 1;
                      } while (uVar18 != uVar27);
                    }
                    uVar30 = uVar30 + 1;
                    pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar18 * 4);
                  } while (uVar30 != uVar3);
                }
                uVar24 = uVar24 + 1;
              } while (uVar24 != local_98);
            }
            local_158 = local_158 + 1;
          } while (local_158 != local_a0);
        }
        local_b8 = lVar31;
        local_a8 = pvVar28;
        local_68 = lVar32;
        if ((uint)local_c0 < 4) {
          iVar25 = (int)local_b0;
          switch((long)&switchD_001c663e::switchdataD_00314df4 +
                 (long)(int)(&switchD_001c663e::switchdataD_00314df4)[local_c0]) {
          case 0x1c6640:
            if (0 < iVar25) {
              uVar24 = 0;
              do {
                fVar35 = *(float *)((long)pvVar28 + uVar24 * 4);
                if (fVar35 <= 0.0) {
                  fVar35 = 0.0;
                }
                *(float *)((long)pvVar28 + uVar24 * 4) = fVar35;
                uVar24 = uVar24 + 1;
              } while (local_b0 != uVar24);
            }
            break;
          case 0x1c6669:
            if (0 < iVar25) {
              fVar35 = *local_d0;
              fVar1 = local_d0[1];
              uVar24 = 0;
              do {
                fVar2 = *(float *)((long)pvVar28 + uVar24 * 4);
                fVar38 = fVar2;
                if (fVar2 <= fVar35) {
                  fVar38 = fVar35;
                }
                if ((fVar2 < fVar35) || (fVar1 < fVar38)) {
                  if (fVar1 <= fVar38) {
                    fVar38 = fVar1;
                  }
                  *(float *)((long)pvVar28 + uVar24 * 4) = fVar38;
                }
                uVar24 = uVar24 + 1;
              } while (local_b0 != uVar24);
            }
            break;
          case 0x1c66ad:
            if (0 < iVar25) {
              uVar24 = 0;
              do {
                fVar35 = expf((float)(*(uint *)((long)local_a8 + uVar24 * 4) ^ auVar36._0_4_));
                auVar43 = _DAT_00312160;
                auVar42 = _DAT_00312150;
                auVar36 = _DAT_003120e0;
                *(float *)((long)local_a8 + uVar24 * 4) = 1.0 / (fVar35 + 1.0);
                uVar24 = uVar24 + 1;
              } while (local_b0 != uVar24);
            }
            break;
          case 0x1c6713:
            if (0 < iVar25) {
              fVar35 = *local_d0;
              uVar24 = 0;
              do {
                fVar1 = *(float *)((long)pvVar28 + uVar24 * 4);
                uVar19 = -(uint)(0.0 < fVar1);
                *(float *)((long)pvVar28 + uVar24 * 4) =
                     (float)(~uVar19 & (uint)fVar35 | uVar19 & 0x3f800000) * fVar1;
                uVar24 = uVar24 + 1;
              } while (local_b0 != uVar24);
            }
          }
        }
        lVar31 = local_b8 + 1;
        lVar32 = local_68 + local_c8;
        local_e8 = (ulong)(uint)((int)local_e8 + local_e0);
        pvVar28 = (void *)((long)local_a8 + local_c8);
      } while (lVar31 != local_70);
    }
    pMVar15 = local_f0;
    cut_padding(local_148,&local_138,local_f0,local_90);
    if ((pMVar15->data == (void *)0x0) || (iVar41 = 0, (long)pMVar15->c * pMVar15->cstep == 0)) {
      iVar41 = -100;
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar6 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}